

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int erkStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  ARKodeButcherTable pAVar1;
  ARKodeHAdaptMem pAVar2;
  int iVar3;
  N_Vector *pp_Var4;
  size_t __nmemb;
  sunrealtype *psVar5;
  code *pcVar6;
  int iVar7;
  long lVar8;
  char *msgfmt;
  size_t __nmemb_00;
  long lVar9;
  ARKodeERKStepMem step_mem;
  
  iVar3 = erkStep_AccessStepMem(ark_mem,"erkStep_Init",&step_mem);
  if ((iVar3 == 0) && (iVar3 = 0, 1 < init_type - 1U)) {
    if ((ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE) &&
       ((ark_mem->user_efun == 0 && (ark_mem->fixedstep != 0)))) {
      ark_mem->user_efun = 0;
      ark_mem->efun = arkEwtSetSmallReal;
      ark_mem->e_data = ark_mem;
    }
    iVar3 = erkStep_SetButcherTable(ark_mem);
    if (iVar3 == 0) {
      iVar3 = erkStep_CheckButcherTable(ark_mem);
      if (iVar3 == 0) {
        pAVar1 = step_mem->B;
        iVar3 = pAVar1->q;
        pAVar2 = ark_mem->hadapt_mem;
        pAVar2->q = iVar3;
        step_mem->q = iVar3;
        iVar3 = pAVar1->p;
        pAVar2->p = iVar3;
        step_mem->p = iVar3;
        if (((ark_mem->fixedstep != 0) && (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE)) ||
           (iVar3 != 0)) {
          if (step_mem->F == (N_Vector *)0x0) {
            pp_Var4 = (N_Vector *)calloc((long)step_mem->stages,8);
            step_mem->F = pp_Var4;
          }
          lVar9 = -1;
          lVar8 = 0;
          do {
            iVar3 = step_mem->stages;
            __nmemb_00 = (size_t)iVar3;
            lVar9 = lVar9 + 1;
            if ((long)__nmemb_00 <= lVar9) {
              lVar9 = ark_mem->liw + __nmemb_00;
              ark_mem->liw = lVar9;
              iVar7 = step_mem->nforcing;
              iVar3 = iVar7 + iVar3 * 2 + 2;
              step_mem->nfusedopvecs = iVar3;
              __nmemb = (size_t)iVar3;
              if (step_mem->cvals == (sunrealtype *)0x0) {
                psVar5 = (sunrealtype *)calloc(__nmemb,8);
                step_mem->cvals = psVar5;
                if (psVar5 == (sunrealtype *)0x0) {
                  return -0x14;
                }
                ark_mem->lrw = ark_mem->lrw + __nmemb;
              }
              if (step_mem->Xvecs == (N_Vector *)0x0) {
                pp_Var4 = (N_Vector *)calloc(__nmemb,8);
                step_mem->Xvecs = pp_Var4;
                if (pp_Var4 == (N_Vector *)0x0) {
                  return -0x14;
                }
                ark_mem->liw = lVar9 + __nmemb;
              }
              if (0 < iVar7) {
                if (step_mem->stage_times == (sunrealtype *)0x0) {
                  psVar5 = (sunrealtype *)calloc(__nmemb_00,8);
                  step_mem->stage_times = psVar5;
                  ark_mem->lrw = ark_mem->lrw + __nmemb_00;
                }
                if (step_mem->stage_coefs == (sunrealtype *)0x0) {
                  psVar5 = (sunrealtype *)calloc(__nmemb_00,8);
                  step_mem->stage_coefs = psVar5;
                  ark_mem->lrw = ark_mem->lrw + __nmemb_00;
                }
              }
              iVar3 = step_mem->q;
              if (iVar3 < 2) {
                if ((iVar3 == 1) && (1 < ark_mem->interp_degree)) {
                  ark_mem->interp_degree = 1;
                }
              }
              else if (iVar3 <= ark_mem->interp_degree) {
                ark_mem->interp_degree = iVar3 + -1;
              }
              if (ark_mem->do_adjoint == 0) {
                pcVar6 = erkStep_TakeStep;
              }
              else {
                pcVar6 = erkStep_TakeStep_Adjoint;
              }
              ark_mem->step = pcVar6;
              ark_mem->call_fullrhs = 1;
              return 0;
            }
            iVar3 = arkAllocVec(ark_mem,ark_mem->ewt,(N_Vector *)(lVar8 + (long)step_mem->F));
            lVar8 = lVar8 + 8;
          } while (iVar3 != 0);
          return -0x14;
        }
        msgfmt = "Temporal error estimation cannot be performed without embedding coefficients";
        iVar7 = 0x1c6;
      }
      else {
        msgfmt = "Error in Butcher table";
        iVar7 = 0x1b8;
      }
    }
    else {
      msgfmt = "Could not create Butcher table";
      iVar7 = 0x1af;
    }
    iVar3 = -0x16;
    arkProcessError(ark_mem,-0x16,iVar7,"erkStep_Init",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,msgfmt);
  }
  return iVar3;
}

Assistant:

int erkStep_Init(ARKodeMem ark_mem, SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                 int init_type)
{
  ARKodeERKStepMem step_mem;
  sunbooleantype reset_efun;
  int retval, j;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return (ARK_SUCCESS);
  }

  /* enforce use of arkEwtSmallReal if using a fixed step size,
     an internal error weight function, and not performing accumulated
     temporal error estimation */
  reset_efun = SUNTRUE;
  if (!ark_mem->fixedstep) { reset_efun = SUNFALSE; }
  if (ark_mem->user_efun) { reset_efun = SUNFALSE; }
  if (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE) { reset_efun = SUNFALSE; }
  if (reset_efun)
  {
    ark_mem->user_efun = SUNFALSE;
    ark_mem->efun      = arkEwtSetSmallReal;
    ark_mem->e_data    = ark_mem;
  }

  /* Create Butcher table (if not already set) */
  retval = erkStep_SetButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Could not create Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Check that Butcher table are OK */
  retval = erkStep_CheckButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Error in Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Retrieve/store method and embedding orders now that table is finalized */
  step_mem->q = ark_mem->hadapt_mem->q = step_mem->B->q;
  step_mem->p = ark_mem->hadapt_mem->p = step_mem->B->p;

  /* Ensure that if adaptivity or error accumulation is enabled, then
       method includes embedding coefficients */
  if ((!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
      (step_mem->p == 0))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Temporal error estimation cannot be performed without embedding coefficients");
    return (ARK_ILL_INPUT);
  }

  /* Allocate ARK RHS vector memory, update storage requirements */
  /*   Allocate F[0] ... F[stages-1] if needed */
  if (step_mem->F == NULL)
  {
    step_mem->F = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
  }
  for (j = 0; j < step_mem->stages; j++)
  {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->F[j])))
    {
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->liw += step_mem->stages; /* pointers */

  /* Allocate reusable arrays for fused vector interface */
  step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
  if (step_mem->cvals == NULL)
  {
    step_mem->cvals = (sunrealtype*)calloc(step_mem->nfusedopvecs,
                                           sizeof(sunrealtype));
    if (step_mem->cvals == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->lrw += step_mem->nfusedopvecs;
  }
  if (step_mem->Xvecs == NULL)
  {
    step_mem->Xvecs = (N_Vector*)calloc(step_mem->nfusedopvecs, sizeof(N_Vector));
    if (step_mem->Xvecs == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->liw += step_mem->nfusedopvecs; /* pointers */
  }

  /* Allocate workspace for MRI forcing -- need to allocate here as the
     number of stages may not bet set before this point and we assume
     SetInnerForcing has been called before the first step i.e., methods
     start with a fast integration */
  if (step_mem->nforcing > 0)
  {
    if (!(step_mem->stage_times))
    {
      step_mem->stage_times = (sunrealtype*)calloc(step_mem->stages,
                                                   sizeof(sunrealtype));
      ark_mem->lrw += step_mem->stages;
    }

    if (!(step_mem->stage_coefs))
    {
      step_mem->stage_coefs = (sunrealtype*)calloc(step_mem->stages,
                                                   sizeof(sunrealtype));
      ark_mem->lrw += step_mem->stages;
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->q > 1 && ark_mem->interp_degree > (step_mem->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->q - 1;
  }
  else if (step_mem->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  /* set appropriate TakeStep routine based on problem configuration */
  if (ark_mem->do_adjoint) { ark_mem->step = erkStep_TakeStep_Adjoint; }
  else { ark_mem->step = erkStep_TakeStep; }

  /* Signal to shared arkode module that full RHS evaluations are required */
  ark_mem->call_fullrhs = SUNTRUE;

  return (ARK_SUCCESS);
}